

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::InstancedGridRenderTest::renderTo
          (InstancedGridRenderTest *this,Context *ctx,ShaderProgram *program,Surface *dst)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  deUint32 dVar5;
  size_type sVar6;
  reference pvVar7;
  float *local_180;
  undefined4 local_16c;
  int local_168;
  DrawArraysCommand command_1;
  DrawElementsCommand command;
  int y_1;
  int x_1;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> colors;
  Vector<float,_4> local_118;
  int local_108;
  int local_104;
  int y;
  int x;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> offsets;
  deUint16 indices [6];
  Vec4 vertexPositions [6];
  float cellH;
  float cellW;
  deInt32 colorLocation;
  deInt32 offsetLocation;
  deInt32 posLocation;
  deUint32 programID;
  deUint32 drawIndirectBuf;
  deUint32 indexBuf;
  deUint32 colorBuf;
  deUint32 offsetBuf;
  deUint32 positionBuf;
  deUint32 vaoID;
  Vec4 yellow;
  Vec4 green;
  Surface *dst_local;
  ShaderProgram *program_local;
  Context *ctx_local;
  InstancedGridRenderTest *this_local;
  
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(yellow.m_data + 2),0.0,1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&positionBuf,1.0,1.0,0.0,1.0);
  offsetBuf = 0;
  colorBuf = 0;
  indexBuf = 0;
  drawIndirectBuf = 0;
  programID = 0;
  posLocation = 0;
  uVar1 = (*ctx->_vptr_Context[0x75])(ctx,program);
  uVar2 = (*ctx->_vptr_Context[0x59])(ctx,(ulong)uVar1,"a_position");
  uVar3 = (*ctx->_vptr_Context[0x59])(ctx,(ulong)uVar1,"a_offset");
  uVar4 = (*ctx->_vptr_Context[0x59])(ctx,(ulong)uVar1,"a_color");
  vertexPositions[5].m_data[3] = 2.0 / (float)this->m_gridSide;
  vertexPositions[5].m_data[2] = 2.0 / (float)this->m_gridSide;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(indices + 2),0.0,0.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(vertexPositions[0].m_data + 2),vertexPositions[5].m_data[3],0.0,
             0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(vertexPositions[1].m_data + 2),0.0,vertexPositions[5].m_data[2],
             0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(vertexPositions[2].m_data + 2),0.0,vertexPositions[5].m_data[2],
             0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(vertexPositions[3].m_data + 2),vertexPositions[5].m_data[3],0.0,
             0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(vertexPositions[4].m_data + 2),vertexPositions[5].m_data[3],
             vertexPositions[5].m_data[2],0.0,1.0);
  stack0xffffffffffffff1c = 0x2000300040000;
  indices[0] = 1;
  indices[1] = 5;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&y);
  for (local_104 = 0; local_104 < this->m_gridSide; local_104 = local_104 + 1) {
    for (local_108 = 0; local_108 < this->m_gridSide; local_108 = local_108 + 1) {
      tcu::Vector<float,_4>::Vector
                (&local_118,(float)local_104 * vertexPositions[5].m_data[3] + -1.0,
                 (float)local_108 * vertexPositions[5].m_data[3] + -1.0,0.0,0.0);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&y,
                 &local_118);
    }
  }
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&y_1);
  for (command.reservedMustBeZero = 0; (int)command.reservedMustBeZero < this->m_gridSide;
      command.reservedMustBeZero = command.reservedMustBeZero + 1) {
    for (command.baseVertex = 0; command.baseVertex < this->m_gridSide;
        command.baseVertex = command.baseVertex + 1) {
      if ((int)(command.reservedMustBeZero + command.baseVertex) % 2 == 0) {
        local_180 = yellow.m_data + 2;
      }
      else {
        local_180 = (float *)&positionBuf;
      }
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&y_1,
                 (value_type *)local_180);
    }
  }
  (*ctx->_vptr_Context[0x4c])(ctx,1,&offsetBuf);
  (*ctx->_vptr_Context[0x4b])(ctx,(ulong)offsetBuf);
  (*ctx->_vptr_Context[0x26])(ctx,1,&colorBuf);
  (*ctx->_vptr_Context[0x25])(ctx,0x8892,(ulong)colorBuf);
  (*ctx->_vptr_Context[0x28])(ctx,0x8892,0x60,indices + 2,0x88e4);
  (*ctx->_vptr_Context[0x4e])(ctx,(ulong)uVar2,4,0x1406,0,0,0);
  (*ctx->_vptr_Context[0x52])(ctx,(ulong)uVar2,0);
  (*ctx->_vptr_Context[0x50])(ctx,(ulong)uVar2);
  (*ctx->_vptr_Context[0x26])(ctx,1,&indexBuf);
  (*ctx->_vptr_Context[0x25])(ctx,0x8892,(ulong)indexBuf);
  sVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                    ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&y);
  pvVar7 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&y,0
                     );
  (*ctx->_vptr_Context[0x28])(ctx,0x8892,sVar6 << 4,pvVar7,0x88e4);
  (*ctx->_vptr_Context[0x4e])(ctx,(ulong)uVar3,4,0x1406,0,0,0);
  (*ctx->_vptr_Context[0x52])(ctx,(ulong)uVar3,1);
  (*ctx->_vptr_Context[0x50])(ctx,(ulong)uVar3);
  (*ctx->_vptr_Context[0x26])(ctx,1,&drawIndirectBuf);
  (*ctx->_vptr_Context[0x25])(ctx,0x8892,(ulong)drawIndirectBuf);
  sVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                    ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&y_1)
  ;
  pvVar7 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&y_1
                      ,0);
  (*ctx->_vptr_Context[0x28])(ctx,0x8892,sVar6 << 4,pvVar7,0x88e4);
  (*ctx->_vptr_Context[0x4e])(ctx,(ulong)uVar4,4,0x1406,0,0,0);
  (*ctx->_vptr_Context[0x52])(ctx,(ulong)uVar4,1);
  (*ctx->_vptr_Context[0x50])(ctx,(ulong)uVar4);
  if ((this->m_useIndices & 1U) != 0) {
    (*ctx->_vptr_Context[0x26])(ctx,1,&programID);
    (*ctx->_vptr_Context[0x25])(ctx,0x8893,(ulong)programID);
    (*ctx->_vptr_Context[0x28])
              (ctx,0x8893,0xc,
               (undefined1 *)
               ((long)&offsets.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),0x88e4);
  }
  (*ctx->_vptr_Context[0x26])(ctx,1,&posLocation);
  (*ctx->_vptr_Context[0x25])(ctx,0x8f3f,(ulong)(uint)posLocation);
  if ((this->m_useIndices & 1U) == 0) {
    local_16c = 6;
    local_168 = this->m_gridSide * this->m_gridSide;
    command_1.count = 0;
    command_1.primCount = 0;
    (*ctx->_vptr_Context[0x28])(ctx,0x8f3f,0x10,&local_16c,0x88e4);
  }
  else {
    command_1.first = 6;
    command_1.reservedMustBeZero = this->m_gridSide * this->m_gridSide;
    (*ctx->_vptr_Context[0x28])(ctx,0x8f3f,0x14,&command_1.first,0x88e4);
  }
  (*ctx->_vptr_Context[0x2a])(0,0,0,0x3f800000);
  (*ctx->_vptr_Context[0x2d])(ctx,0x4000);
  uVar2 = tcu::Surface::getWidth(dst);
  uVar3 = tcu::Surface::getHeight(dst);
  (*ctx->_vptr_Context[5])(ctx,0,0,(ulong)uVar2,(ulong)uVar3);
  (*ctx->_vptr_Context[0x76])(ctx,(ulong)uVar1);
  if ((this->m_useIndices & 1U) == 0) {
    (*ctx->_vptr_Context[0x70])(ctx,4,0);
  }
  else {
    (*ctx->_vptr_Context[0x71])(ctx,4,0x1403,0);
  }
  (*ctx->_vptr_Context[0x76])(ctx,0);
  dVar5 = (*ctx->_vptr_Context[0x79])();
  glu::checkError(dVar5,"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawTests.cpp"
                  ,0x398);
  (*ctx->_vptr_Context[0x27])(ctx,1,&posLocation);
  if ((this->m_useIndices & 1U) != 0) {
    (*ctx->_vptr_Context[0x27])(ctx,1,&programID);
  }
  (*ctx->_vptr_Context[0x27])(ctx,1,&drawIndirectBuf);
  (*ctx->_vptr_Context[0x27])(ctx,1,&indexBuf);
  (*ctx->_vptr_Context[0x27])(ctx,1,&colorBuf);
  (*ctx->_vptr_Context[0x4d])(ctx,1,&offsetBuf);
  (*ctx->_vptr_Context[0x77])(ctx,(ulong)uVar1);
  (*ctx->_vptr_Context[0x7a])();
  uVar1 = tcu::Surface::getWidth(dst);
  uVar2 = tcu::Surface::getHeight(dst);
  (*ctx->_vptr_Context[0x80])(ctx,dst,0,0,(ulong)uVar1,(ulong)uVar2);
  dVar5 = (*ctx->_vptr_Context[0x79])();
  glu::checkError(dVar5,"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawTests.cpp"
                  ,0x3a6);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&y_1);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&y);
  return;
}

Assistant:

void InstancedGridRenderTest::renderTo (sglr::Context& ctx, sglr::ShaderProgram& program, tcu::Surface& dst)
{
	const tcu::Vec4 green	(0, 1, 0, 1);
	const tcu::Vec4 yellow	(1, 1, 0, 1);

	deUint32 vaoID			= 0;
	deUint32 positionBuf	= 0;
	deUint32 offsetBuf		= 0;
	deUint32 colorBuf		= 0;
	deUint32 indexBuf		= 0;
	deUint32 drawIndirectBuf= 0;
	deUint32 programID		= ctx.createProgram(&program);
	deInt32 posLocation		= ctx.getAttribLocation(programID, "a_position");
	deInt32 offsetLocation	= ctx.getAttribLocation(programID, "a_offset");
	deInt32 colorLocation	= ctx.getAttribLocation(programID, "a_color");

	float cellW	= 2.0f / (float)m_gridSide;
	float cellH	= 2.0f / (float)m_gridSide;
	const tcu::Vec4 vertexPositions[] =
	{
		tcu::Vec4(0,		0,		0, 1),
		tcu::Vec4(cellW,	0,		0, 1),
		tcu::Vec4(0,		cellH,	0, 1),

		tcu::Vec4(0,		cellH,	0, 1),
		tcu::Vec4(cellW,	0,		0, 1),
		tcu::Vec4(cellW,	cellH,	0, 1),
	};

	const deUint16 indices[] =
	{
		0, 4, 3,
		2, 1, 5
	};

	std::vector<tcu::Vec4> offsets;
	for (int x = 0; x < m_gridSide; ++x)
	for (int y = 0; y < m_gridSide; ++y)
		offsets.push_back(tcu::Vec4((float)x * cellW - 1.0f, (float)y * cellW - 1.0f, 0, 0));

	std::vector<tcu::Vec4> colors;
	for (int x = 0; x < m_gridSide; ++x)
	for (int y = 0; y < m_gridSide; ++y)
		colors.push_back(((x + y) % 2 == 0) ? (green) : (yellow));

	ctx.genVertexArrays(1, &vaoID);
	ctx.bindVertexArray(vaoID);

	ctx.genBuffers(1, &positionBuf);
	ctx.bindBuffer(GL_ARRAY_BUFFER, positionBuf);
	ctx.bufferData(GL_ARRAY_BUFFER, sizeof(vertexPositions), vertexPositions, GL_STATIC_DRAW);
	ctx.vertexAttribPointer(posLocation, 4, GL_FLOAT, GL_FALSE, 0, DE_NULL);
	ctx.vertexAttribDivisor(posLocation, 0);
	ctx.enableVertexAttribArray(posLocation);

	ctx.genBuffers(1, &offsetBuf);
	ctx.bindBuffer(GL_ARRAY_BUFFER, offsetBuf);
	ctx.bufferData(GL_ARRAY_BUFFER, offsets.size() * sizeof(tcu::Vec4), &offsets[0], GL_STATIC_DRAW);
	ctx.vertexAttribPointer(offsetLocation, 4, GL_FLOAT, GL_FALSE, 0, DE_NULL);
	ctx.vertexAttribDivisor(offsetLocation, 1);
	ctx.enableVertexAttribArray(offsetLocation);

	ctx.genBuffers(1, &colorBuf);
	ctx.bindBuffer(GL_ARRAY_BUFFER, colorBuf);
	ctx.bufferData(GL_ARRAY_BUFFER, colors.size() * sizeof(tcu::Vec4), &colors[0], GL_STATIC_DRAW);
	ctx.vertexAttribPointer(colorLocation, 4, GL_FLOAT, GL_FALSE, 0, DE_NULL);
	ctx.vertexAttribDivisor(colorLocation, 1);
	ctx.enableVertexAttribArray(colorLocation);

	if (m_useIndices)
	{
		ctx.genBuffers(1, &indexBuf);
		ctx.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, indexBuf);
		ctx.bufferData(GL_ELEMENT_ARRAY_BUFFER, sizeof(indices), indices, GL_STATIC_DRAW);
	}

	ctx.genBuffers(1, &drawIndirectBuf);
	ctx.bindBuffer(GL_DRAW_INDIRECT_BUFFER, drawIndirectBuf);

	if (m_useIndices)
	{
		DrawElementsCommand command;
		command.count				= 6;
		command.primCount			= m_gridSide * m_gridSide;
		command.firstIndex			= 0;
		command.baseVertex			= 0;
		command.reservedMustBeZero	= 0;

		ctx.bufferData(GL_DRAW_INDIRECT_BUFFER, sizeof(command), &command, GL_STATIC_DRAW);
	}
	else
	{
		DrawArraysCommand command;
		command.count				= 6;
		command.primCount			= m_gridSide * m_gridSide;
		command.first				= 0;
		command.reservedMustBeZero	= 0;

		ctx.bufferData(GL_DRAW_INDIRECT_BUFFER, sizeof(command), &command, GL_STATIC_DRAW);
	}

	ctx.clearColor(0, 0, 0, 1);
	ctx.clear(GL_COLOR_BUFFER_BIT);

	ctx.viewport(0, 0, dst.getWidth(), dst.getHeight());

	ctx.useProgram(programID);
	if (m_useIndices)
		ctx.drawElementsIndirect(GL_TRIANGLES, GL_UNSIGNED_SHORT, DE_NULL);
	else
		ctx.drawArraysIndirect(GL_TRIANGLES, DE_NULL);
	ctx.useProgram(0);

	glu::checkError(ctx.getError(), "", __FILE__, __LINE__);

	ctx.deleteBuffers(1, &drawIndirectBuf);
	if (m_useIndices)
		ctx.deleteBuffers(1, &indexBuf);
	ctx.deleteBuffers(1, &colorBuf);
	ctx.deleteBuffers(1, &offsetBuf);
	ctx.deleteBuffers(1, &positionBuf);
	ctx.deleteVertexArrays(1, &vaoID);
	ctx.deleteProgram(programID);

	ctx.finish();
	ctx.readPixels(dst, 0, 0, dst.getWidth(), dst.getHeight());

	glu::checkError(ctx.getError(), "", __FILE__, __LINE__);
}